

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::OricMFMDSK::get_track_at_position(OricMFMDSK *this,Address address)

{
  uint8_t uVar1;
  byte bVar2;
  mutex *__m;
  long offset;
  pointer pEVar3;
  uint uVar4;
  Address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Storage::Disk::Track> sVar6;
  undefined1 local_d0 [28];
  int byte_1;
  int byte;
  uint8_t next_byte;
  bool did_sync;
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  encoder;
  uint8_t last_header [6];
  size_t track_offset;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> lock_guard;
  PCMSegment segment;
  OricMFMDSK *this_local;
  Address address_local;
  ulong uVar5;
  
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)address;
  PCMSegment::PCMSegment((PCMSegment *)&lock_guard);
  __m = FileHolder::get_file_access_mutex((FileHolder *)((long)address + 8));
  std::lock_guard<std::mutex>::lock_guard(&local_80,__m);
  offset = get_file_offset_for_position((OricMFMDSK *)address,in_RDX);
  FileHolder::seek((FileHolder *)((long)address + 8),offset,0);
  _last_header = (_Bit_type *)0x0;
  encoder._M_t.
  super___uniq_ptr_impl<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_Storage::Encodings::MFM::Encoder_*,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  .super__Head_base<0UL,_Storage::Encodings::MFM::Encoder_*,_false>._M_head_impl._4_2_ = 0;
  encoder._M_t.
  super___uniq_ptr_impl<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_Storage::Encodings::MFM::Encoder_*,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  .super__Head_base<0UL,_Storage::Encodings::MFM::Encoder_*,_false>._M_head_impl._0_4_ = 0;
  Encodings::MFM::GetMFMEncoder
            ((MFM *)&byte,(vector<bool,_std::allocator<bool>_> *)&segment,
             (vector<bool,_std::allocator<bool>_> *)0x0);
  byte_1._3_1_ = 0;
  do {
    while( true ) {
      while( true ) {
        if ((_Bit_type *)0x1869 < _last_header) {
          std::
          unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
          ::~unique_ptr((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                         *)&byte);
          std::lock_guard<std::mutex>::~lock_guard(&local_80);
          std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>
                    ((PCMSegment *)local_d0);
          std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
                    ((shared_ptr<Storage::Disk::Track> *)this,
                     (shared_ptr<Storage::Disk::PCMTrack> *)local_d0);
          std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
                    ((shared_ptr<Storage::Disk::PCMTrack> *)local_d0);
          PCMSegment::~PCMSegment((PCMSegment *)&lock_guard);
          sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = extraout_RDX._M_pi;
          sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this;
          return (shared_ptr<Storage::Disk::Track>)
                 sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
        }
        byte_1._2_1_ = FileHolder::get8((FileHolder *)((long)address + 8));
        _last_header = (_Bit_type *)((long)_last_header + 1);
        if (byte_1._2_1_ != 0xa1) break;
        pEVar3 = std::
                 unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                 ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                               *)&byte);
        (*pEVar3->_vptr_Encoder[8])(pEVar3,0x4489,0);
        byte_1._3_1_ = 1;
      }
      if (byte_1._2_1_ != 0xc2) break;
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                             *)&byte);
      (*pEVar3->_vptr_Encoder[8])(pEVar3,0x5224,0);
    }
    pEVar3 = std::
             unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
             ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                           *)&byte);
    (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)byte_1._2_1_,0);
    if ((byte_1._3_1_ & 1) != 0) {
      if (byte_1._2_1_ == 0xfb) {
        local_d0._20_4_ = 0;
        while( true ) {
          uVar4 = (0x80 << (encoder._M_t.
                            super___uniq_ptr_impl<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Storage::Encodings::MFM::Encoder_*,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                            .super__Head_base<0UL,_Storage::Encodings::MFM::Encoder_*,_false>.
                            _M_head_impl._3_1_ & 0x1f)) + 2;
          uVar5 = (ulong)uVar4;
          if ((int)uVar4 <= (int)local_d0._20_4_) break;
          pEVar3 = std::
                   unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                   ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                                 *)&byte);
          bVar2 = FileHolder::get8((FileHolder *)((long)address + 8));
          (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)bVar2,0,CONCAT71((int7)(uVar5 >> 8),bVar2));
          _last_header = (_Bit_type *)((long)_last_header + 1);
          if (_last_header == (_Bit_type *)0x1900) break;
          local_d0._20_4_ = local_d0._20_4_ + 1;
        }
      }
      else if (byte_1._2_1_ == 0xfe) {
        for (local_d0._24_4_ = 0; (int)local_d0._24_4_ < 6; local_d0._24_4_ = local_d0._24_4_ + 1) {
          uVar1 = FileHolder::get8((FileHolder *)((long)address + 8));
          last_header[(long)(int)local_d0._24_4_ + -8] = uVar1;
          pEVar3 = std::
                   unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                   ::operator->((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                                 *)&byte);
          (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)last_header[(long)(int)local_d0._24_4_ + -8],0);
          _last_header = (_Bit_type *)((long)_last_header + 1);
          if (_last_header == (_Bit_type *)0x186a) break;
        }
      }
    }
    byte_1._3_1_ = 0;
  } while( true );
}

Assistant:

std::shared_ptr<Track> OricMFMDSK::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(get_file_offset_for_position(address), SEEK_SET);

		// The file format omits clock bits. So it's not a genuine MFM capture.
		// A consumer must contextually guess when an FB, FC, etc is meant to be a control mark.
		std::size_t track_offset = 0;
		uint8_t last_header[6] = {0, 0, 0, 0, 0, 0};
		std::unique_ptr<Encodings::MFM::Encoder> encoder = Encodings::MFM::GetMFMEncoder(segment.data);
		bool did_sync = false;
		while(track_offset < 6250) {
			uint8_t next_byte = file_.get8();
			track_offset++;

			switch(next_byte) {
				default: {
					encoder->add_byte(next_byte);
					if(did_sync) {
						switch(next_byte) {
							default: break;

							case 0xfe:
								for(int byte = 0; byte < 6; byte++) {
									last_header[byte] = file_.get8();
									encoder->add_byte(last_header[byte]);
									++track_offset;
									if(track_offset == 6250) break;
								}
							break;

							case 0xfb:
								for(int byte = 0; byte < (128 << last_header[3]) + 2; byte++) {
									encoder->add_byte(file_.get8());
									++track_offset;
									// Special exception: don't interrupt a sector body if it seems to
									// be about to run over the end of the track. It seems like BD-500
									// disks break the usual 6250-byte rule, pushing out to just less
									// than 6400 bytes total.
									if(track_offset == 6400) break;
								}
							break;
						}
					}

					did_sync = false;
				}
				break;

				case 0xa1:	// a synchronisation mark that implies a sector or header coming
					encoder->output_short(Storage::Encodings::MFM::MFMSync);
					did_sync = true;
				break;

				case 0xc2:	// an 'ordinary' synchronisation mark
					encoder->output_short(Storage::Encodings::MFM::MFMIndexSync);
				break;
			}
		}
	}

	return std::make_shared<PCMTrack>(segment);
}